

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall
pbrt::syntactic::Attributes::insertNamedMaterial
          (Attributes *this,string *name,shared_ptr<pbrt::syntactic::Material> *material)

{
  shared_ptr<pbrt::syntactic::Material> *in_RDX;
  Attributes *in_RSI;
  shared_ptr<pbrt::syntactic::Material> *in_RDI;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Material>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Material>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Material>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Material>_>_>_>
                *)this,name);
  std::shared_ptr<pbrt::syntactic::Material>::operator=(in_RDI,in_RDX);
  modified(in_RSI);
  return;
}

Assistant:

void insertNamedMaterial(std::string name,
                               std::shared_ptr<Material> material) {
        namedMaterial[name] = material;
        modified();
      }